

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

bool __thiscall
bloaty::RangeSink::IsVerboseForFileRange(RangeSink *this,uint64_t fileoff,uint64_t filesize)

{
  _Base_ptr *buffer;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  const_iterator iter;
  Nonnull<char_*> pcVar5;
  Arg *in_R9;
  bool bVar6;
  string_view format;
  RangeMap vm_map;
  RangeMap file_map;
  string local_b0;
  undefined1 local_90 [8];
  _Rb_tree_node_base local_88;
  size_t local_68;
  undefined1 local_60 [16];
  _Base_ptr local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  size_t local_38;
  
  if (filesize == 0xffffffffffffffff) {
    filesize = ~fileoff;
  }
  if (filesize <= ~fileoff) {
    bVar6 = true;
    if (((this->options_).verbose_level_ < 2) &&
       (((uVar1 = (this->options_)._has_bits_.has_bits_[0], -1 < (char)uVar1 ||
         (uVar2 = (this->options_).debug_fileoff_, uVar2 < fileoff || filesize + fileoff <= uVar2))
        && (bVar6 = false, (uVar1 & 0x40) != 0 && this->translator_ != (DualMap *)0x0)))) {
      local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
      local_88._M_parent = (_Base_ptr)0x0;
      local_68 = 0;
      local_48 = (_Base_ptr)(local_60 + 8);
      local_60._8_8_ = local_60._8_8_ & 0xffffffff00000000;
      local_50 = (_Base_ptr)0x0;
      local_38 = 0;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_88._M_left = &local_88;
      local_88._M_right = &local_88;
      local_40 = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,anon_var_dwarf_3f49e9 + 0x11);
      RangeMap::AddRangeWithTranslation
                ((RangeMap *)local_60,fileoff,filesize,&local_b0,&this->translator_->file_map,false,
                 (RangeMap *)local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      bVar6 = false;
      if (local_88._M_left != &local_88) {
        iter._M_node = local_88._M_left;
        bVar6 = false;
        do {
          uVar2 = *(ulong *)(iter._M_node + 1);
          uVar4 = RangeMap::RangeEndUnknownLimit((RangeMap *)local_90,iter,0xffffffffffffffff);
          if ((1 < (this->options_).verbose_level_) ||
             (((((this->options_)._has_bits_.has_bits_[0] & 0x40) != 0 &&
               (uVar3 = (this->options_).debug_vmaddr_, uVar2 <= uVar3)) &&
              (uVar3 < (uVar4 + uVar2) - *(long *)(iter._M_node + 1))))) {
            bVar6 = true;
          }
          iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
        } while (iter._M_node != &local_88);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                   *)local_60);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                   *)local_90);
    }
    return bVar6;
  }
  buffer = &local_88._M_parent;
  pcVar5 = absl::numbers_internal::FastIntToBuffer(fileoff,(Nonnull<char_*>)buffer);
  local_90 = (undefined1  [8])((long)pcVar5 - (long)buffer);
  local_88._0_8_ = buffer;
  pcVar5 = absl::numbers_internal::FastIntToBuffer(filesize,(Nonnull<char_*>)&local_50);
  local_60._0_8_ = (long)pcVar5 - (long)&local_50;
  format._M_str = local_90;
  format._M_len = (size_t)"Overflow in file range, fileoff=$0, filesize=$1";
  local_60._8_8_ = &local_50;
  absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x2f,format,(Arg *)local_60,in_R9);
  Throw(local_b0._M_dataplus._M_p,0x479);
}

Assistant:

bool RangeSink::IsVerboseForFileRange(uint64_t fileoff, uint64_t filesize) {
  if (filesize == RangeMap::kUnknownSize) {
    filesize = UINT64_MAX - fileoff;
  }

  if (fileoff + filesize < fileoff) {
    THROWF("Overflow in file range, fileoff=$0, filesize=$1", fileoff,
           filesize);
  }

  if (ContainsVerboseFileOffset(fileoff, filesize)) {
    return true;
  }

  if (translator_ && options_.has_debug_vmaddr()) {
    RangeMap vm_map;
    RangeMap file_map;
    bool contains = false;
    file_map.AddRangeWithTranslation(fileoff, filesize, "",
                                     translator_->file_map, false, &vm_map);
    vm_map.ForEachRange([this, &contains](uint64_t vmaddr, uint64_t vmsize) {
      if (ContainsVerboseVMAddr(vmaddr, vmsize)) {
        contains = true;
      }
    });
    return contains;
  }

  return false;
}